

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O3

void __thiscall xray_re::xr_envelope::insert_key(xr_envelope *this,float time,float value)

{
  float *pfVar1;
  xr_key *pxVar2;
  xr_key *key_1;
  pointer ppxVar3;
  pointer ppxVar4;
  const_iterator __position;
  bool bVar5;
  float fVar6;
  xr_key *key;
  value_type local_18;
  
  ppxVar3 = (this->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppxVar4 = (this->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __position._M_current = ppxVar3;
  if (ppxVar3 == ppxVar4) goto LAB_0015d846;
  pxVar2 = *ppxVar3;
  if ((long)ppxVar4 - (long)ppxVar3 == 8) {
    if (pxVar2->shape == '\x04') {
      if ((pxVar2->value == value) && (!NAN(pxVar2->value) && !NAN(value))) {
        return;
      }
    }
    __position._M_current = ppxVar4;
    if (time < pxVar2->time) {
      __position._M_current = ppxVar3;
    }
    goto LAB_0015d846;
  }
  if (pxVar2->time <= time) {
    pxVar2 = ppxVar4[-1];
    if (time < pxVar2->time || time == pxVar2->time) {
      ppxVar3 = ppxVar3 + -1;
      do {
        ppxVar4 = ppxVar3 + 2;
        ppxVar3 = ppxVar3 + 1;
        pfVar1 = &(*ppxVar4)->time;
      } while (*pfVar1 <= time && time != *pfVar1);
      __position._M_current = ppxVar3;
      if ((*ppxVar4)->shape != '\x04') goto LAB_0015d846;
      fVar6 = (*ppxVar3)->value;
      goto LAB_0015d83f;
    }
    __position._M_current = ppxVar4;
    if (pxVar2->shape != '\x04') goto LAB_0015d846;
    fVar6 = pxVar2->value;
    bVar5 = NAN(fVar6) || NAN(value);
  }
  else {
    if (pxVar2->shape != '\x04') goto LAB_0015d846;
    fVar6 = pxVar2->value;
LAB_0015d83f:
    bVar5 = NAN(fVar6) || NAN(value);
    ppxVar4 = ppxVar3;
  }
  __position._M_current = ppxVar4;
  if ((fVar6 == value) && (!bVar5)) {
    return;
  }
LAB_0015d846:
  local_18 = (value_type)operator_new(0x28);
  local_18->time = time;
  local_18->value = value;
  local_18->shape = '\x04';
  std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::insert
            (&this->m_keys,__position,&local_18);
  return;
}

Assistant:

void xr_envelope::insert_key(float time, float value)
{
	xr_key_vec_it it;
#if 0
	it = m_keys.end();
#else
	if (m_keys.empty()) {
		it = m_keys.begin();
	} else if (m_keys.size() == 1) {
		xr_key* key = m_keys.front();
		switch (key->shape) {
		case xr_key::SHAPE_STEP:
			if (value == key->value)
				return;
			break;

		default:
			break;
		}
		if (time < key->time)
			it = m_keys.begin();
		else
			it = m_keys.end();
	} else {
		xr_key* skey = m_keys.front();
		xr_key* ekey = m_keys.back();

		if (time < skey->time) {
			switch (skey->shape) {
			case xr_key::SHAPE_STEP:
				if (value == skey->value)
					return;
				break;

			default:
				break;
			}
			it = m_keys.begin();
		} else if (ekey->time < time) {
			switch (ekey->shape) {
			case xr_key::SHAPE_STEP:
				if (value == ekey->value)
					return;
				break;

			default:
				break;
			}
			it = m_keys.end();
		} else {
			for (it = m_keys.begin() + 1; (*it)->time < time; ++it) {}
			xr_key* key1 = *it;
			xr_key* key0 = *--it;
			switch (key1->shape) {
			case xr_key::SHAPE_STEP:
				if (value == key0->value)
					return;
				break;

			default:
				break;
			};
		}
	}
#endif
	xr_key* key = new xr_key;
	key->time = time;
	key->value = value;
	key->shape = xr_key::SHAPE_STEP;
	m_keys.insert(it, key);
}